

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

Map * google::protobuf::internal::CounterMap(void)

{
  int iVar1;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
  *this;
  
  if (CounterMap()::counter_map == '\0') {
    iVar1 = __cxa_guard_acquire(&CounterMap()::counter_map);
    if (iVar1 != 0) {
      this = (map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
              *)operator_new(0x30);
      memset(this,0,0x30);
      std::
      map<std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::map<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>,_std::less<std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::variant<long,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::vector<const_google::protobuf::internal::RealDebugCounter_*,_std::allocator<const_google::protobuf::internal::RealDebugCounter_*>_>_>_>_>_>_>_>
      ::map(this);
      CounterMap::counter_map = this;
      __cxa_guard_release(&CounterMap()::counter_map);
    }
  }
  if (CounterMap()::dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&CounterMap()::dummy);
    if (iVar1 != 0) {
      iVar1 = atexit(PrintAllCounters);
      CounterMap::dummy = iVar1 != 0;
      __cxa_guard_release(&CounterMap()::dummy);
    }
  }
  return CounterMap::counter_map;
}

Assistant:

static auto& CounterMap() {
  using Map = std::map<absl::string_view,
                       std::map<std::variant<int64_t, absl::string_view>,
                                std::vector<const RealDebugCounter*>>>;
  static auto* counter_map = new Map{};
  static bool dummy = std::atexit(PrintAllCounters);
  (void)dummy;
  return *counter_map;
}